

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O0

WJTL_STATUS TestMarshallArrayStructs(void)

{
  WJTL_STATUS WVar1;
  undefined2 local_2e0;
  undefined2 local_2de;
  _Bool _result_1;
  InnerStructX2 inner2 [4];
  InnerStructX1 inner1 [4];
  undefined8 uStack_2b0;
  _Bool _result;
  OuterStructX theStructX;
  JlMarshallElement marshalOuterX [4];
  JlMarshallElement marshalStructX2 [1];
  JlMarshallElement marshalStructX1 [1];
  WJTL_STATUS local_c;
  WJTL_STATUS TestReturn;
  
  local_c = WJTL_STATUS_SUCCESS;
  memcpy(&marshalStructX2[0].ChildStructDescriptionCount,&DAT_00150490,0x60);
  memcpy(&marshalOuterX[3].ChildStructDescriptionCount,&DAT_001504f0,0x60);
  theStructX.struct2VarCount._0_4_ = 5;
  marshalOuterX[0]._0_8_ = anon_var_dwarf_e6f5;
  marshalOuterX[0].Name._0_1_ = 1;
  marshalOuterX[0].IsArray = false;
  marshalOuterX[0]._17_7_ = 0;
  marshalOuterX[0].FieldOffset = 0x20;
  marshalOuterX[0].FieldSize = 0x20;
  marshalOuterX[0].CountFieldOffset = 8;
  marshalOuterX[0].CountFieldSize = 0x20;
  marshalOuterX[0].ArrayFieldSize = 8;
  marshalOuterX[0].ArrayItemSize._0_4_ = 0;
  marshalOuterX[0].ArrayItemSize._4_1_ = 0;
  marshalOuterX[0].ArrayItemSize._5_1_ = 0;
  marshalOuterX[0]._72_8_ = &marshalStructX2[0].ChildStructDescriptionCount;
  marshalOuterX[0].ChildStructDescription._0_4_ = 1;
  marshalOuterX[0].ChildStructDescriptionCount = 5;
  marshalOuterX[1]._0_8_ = anon_var_dwarf_e700;
  marshalOuterX[1].Name._0_1_ = 1;
  marshalOuterX[1].IsArray = true;
  marshalOuterX[1]._17_7_ = 0;
  marshalOuterX[1].FieldOffset = 8;
  marshalOuterX[1].FieldSize = 0x30;
  marshalOuterX[1].CountFieldOffset = 8;
  marshalOuterX[1].CountFieldSize = 0;
  marshalOuterX[1].ArrayFieldSize = 8;
  marshalOuterX[1].ArrayItemSize._0_4_ = 0;
  marshalOuterX[1].ArrayItemSize._4_1_ = 0;
  marshalOuterX[1].ArrayItemSize._5_1_ = 0;
  marshalOuterX[1]._72_8_ = &marshalStructX2[0].ChildStructDescriptionCount;
  marshalOuterX[1].ChildStructDescription._0_4_ = 1;
  marshalOuterX[1].ChildStructDescriptionCount = 5;
  marshalOuterX[2]._0_8_ = anon_var_dwarf_e70b;
  marshalOuterX[2].Name._0_1_ = 1;
  marshalOuterX[2].IsArray = true;
  marshalOuterX[2]._17_7_ = 0;
  marshalOuterX[2].FieldOffset = 8;
  marshalOuterX[2].FieldSize = 0x40;
  marshalOuterX[2].CountFieldOffset = 8;
  marshalOuterX[2].CountFieldSize = 8;
  marshalOuterX[2].ArrayFieldSize = 2;
  marshalOuterX[2].ArrayItemSize._0_4_ = 0;
  marshalOuterX[2].ArrayItemSize._4_1_ = 0;
  marshalOuterX[2].ArrayItemSize._5_1_ = 0;
  marshalOuterX[2]._72_8_ = &marshalOuterX[3].ChildStructDescriptionCount;
  marshalOuterX[2].ChildStructDescription._0_4_ = 1;
  marshalOuterX[2].ChildStructDescriptionCount = 5;
  marshalOuterX[3]._0_8_ = anon_var_dwarf_e716;
  marshalOuterX[3].Name._0_1_ = 1;
  marshalOuterX[3].IsArray = true;
  marshalOuterX[3]._17_7_ = 0;
  marshalOuterX[3].FieldOffset = 8;
  marshalOuterX[3].FieldSize = 0x50;
  marshalOuterX[3].CountFieldOffset = 8;
  marshalOuterX[3].CountFieldSize = 0;
  marshalOuterX[3].ArrayFieldSize = 2;
  marshalOuterX[3].ArrayItemSize._0_4_ = 0;
  marshalOuterX[3].ArrayItemSize._4_1_ = 0;
  marshalOuterX[3].ArrayItemSize._5_1_ = 0;
  marshalOuterX[3]._72_8_ = &marshalOuterX[3].ChildStructDescriptionCount;
  marshalOuterX[3].ChildStructDescription._0_4_ = 1;
  memset(&stack0xfffffffffffffd50,0,0x58);
  WVar1 = MakeJsonAndVerify(&stack0xfffffffffffffd50,
                            (JlMarshallElement *)&theStructX.struct2VarCount,4,
                            "{\"struct1Fixed\":[],\"struct1Var\":[],\"struct2Fixed\":[],\"struct2Var\":[]}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStructX, marshalOuterX, ( sizeof(marshalOuterX) / sizeof((marshalOuterX)[0]) ), \"{\\\"struct1Fixed\\\":[],\\\"struct1Var\\\":[],\" \"\\\"struct2Fixed\\\":[],\\\"struct2Var\\\":[]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStructs",0x260);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  uStack_2b0 = 1;
  theStructX.struct1Fixed[0].Number64 = 2;
  theStructX.struct1Fixed[1].Number64 = 3;
  theStructX.struct1Fixed[3].Number64 = 3;
  memset(inner2,0,0x20);
  inner2[0].Number16 = 4;
  inner2[1].Number16 = 0;
  inner2[2].Number16 = 0;
  inner2[3].Number16 = 0;
  theStructX.struct1FixedCount = (size_t)inner2;
  theStructX.struct1Var = (InnerStructX1 *)0x2;
  theStructX.struct1VarCount._0_2_ = 6;
  theStructX.struct1VarCount._2_2_ = 7;
  theStructX.struct1VarCount._4_2_ = 8;
  theStructX.struct2Fixed[0].Number16 = 3;
  theStructX.struct2Fixed[1].Number16 = 0;
  theStructX.struct2Fixed[2].Number16 = 0;
  theStructX.struct2Fixed[3].Number16 = 0;
  memset(&local_2e0,0,8);
  local_2e0 = 9;
  local_2de = 10;
  theStructX.struct2FixedCount = (size_t)&local_2e0;
  theStructX.struct2Var = (InnerStructX2 *)0x2;
  WVar1 = MakeJsonAndVerify(&stack0xfffffffffffffd50,
                            (JlMarshallElement *)&theStructX.struct2VarCount,4,
                            "{\"struct1Fixed\":[{\"num64\":1},{\"num64\":2},{\"num64\":3}],\"struct1Var\":[{\"num64\":4},{\"num64\":5}],\"struct2Fixed\":[{\"num16\":6},{\"num16\":7},{\"num16\":8}],\"struct2Var\":[{\"num16\":9},{\"num16\":10}]}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStructX, marshalOuterX, ( sizeof(marshalOuterX) / sizeof((marshalOuterX)[0]) ), \"{\\\"struct1Fixed\\\":[{\\\"num64\\\":1},{\\\"num64\\\":2},{\\\"num64\\\":3}],\" \"\\\"struct1Var\\\":[{\\\"num64\\\":4},{\\\"num64\\\":5}],\" \"\\\"struct2Fixed\\\":[{\\\"num16\\\":6},{\\\"num16\\\":7},{\\\"num16\\\":8}],\" \"\\\"struct2Var\\\":[{\\\"num16\\\":9},{\\\"num16\\\":10}]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStructs",0x27b);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  return local_c;
}

Assistant:

static
WJTL_STATUS
    TestMarshallArrayStructs
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint64_t    Number64;
    } InnerStructX1;

    typedef struct
    {
        uint16_t    Number16;
    } InnerStructX2;

    typedef struct
    {
        InnerStructX1   struct1Fixed[4];
        size_t          struct1FixedCount;
        InnerStructX1*  struct1Var;
        size_t          struct1VarCount;
        InnerStructX2   struct2Fixed[4];
        size_t          struct2FixedCount;
        InnerStructX2*  struct2Var;
        size_t          struct2VarCount;
    } OuterStructX;

    JlMarshallElement marshalStructX1[] =
    {
        JlMarshallUnsigned( InnerStructX1, Number64, "num64" ),
    };
    JlMarshallElement marshalStructX2[] =
    {
        JlMarshallUnsigned( InnerStructX2, Number16, "num16" ),
    };
    JlMarshallElement marshalOuterX[] =
    {
        JlMarshallStructFixedArray( OuterStructX, struct1Fixed, struct1FixedCount, "struct1Fixed", InnerStructX1, marshalStructX1, NumElements(marshalStructX1) ),
        JlMarshallStructArray( OuterStructX, struct1Var, struct1VarCount, "struct1Var", InnerStructX1, marshalStructX1, NumElements(marshalStructX1) ),
        JlMarshallStructFixedArray( OuterStructX, struct2Fixed, struct2FixedCount, "struct2Fixed", InnerStructX2, marshalStructX2, NumElements(marshalStructX2) ),
        JlMarshallStructArray( OuterStructX, struct2Var, struct2VarCount, "struct2Var", InnerStructX2, marshalStructX2, NumElements(marshalStructX2) ),
    };

    OuterStructX theStructX = {{{0}}};

    // Test empty
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStructX, marshalOuterX, NumElements(marshalOuterX),
                                          "{\"struct1Fixed\":[],\"struct1Var\":[],"
                                          "\"struct2Fixed\":[],\"struct2Var\":[]}" ) );

    // Now with data
    theStructX.struct1Fixed[0].Number64 = 1;
    theStructX.struct1Fixed[1].Number64 = 2;
    theStructX.struct1Fixed[2].Number64 = 3;
    theStructX.struct1FixedCount = 3;
    InnerStructX1 inner1 [4] = {{0}};
    inner1[0].Number64 = 4;
    inner1[1].Number64 = 5;
    theStructX.struct1Var = inner1;
    theStructX.struct1VarCount = 2;

    theStructX.struct2Fixed[0].Number16 = 6;
    theStructX.struct2Fixed[1].Number16 = 7;
    theStructX.struct2Fixed[2].Number16 = 8;
    theStructX.struct2FixedCount = 3;
    InnerStructX2 inner2 [4] = {{0}};
    inner2[0].Number16 = 9;
    inner2[1].Number16 = 10;
    theStructX.struct2Var = inner2;
    theStructX.struct2VarCount = 2;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStructX, marshalOuterX, NumElements(marshalOuterX),
                                          "{\"struct1Fixed\":[{\"num64\":1},{\"num64\":2},{\"num64\":3}],"
                                          "\"struct1Var\":[{\"num64\":4},{\"num64\":5}],"
                                          "\"struct2Fixed\":[{\"num16\":6},{\"num16\":7},{\"num16\":8}],"
                                          "\"struct2Var\":[{\"num16\":9},{\"num16\":10}]}" ) );

    return TestReturn;
}